

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playmidi.cpp
# Opt level: O0

void __thiscall Timidity::Renderer::note_on(Renderer *this,int chan,int note,int vel)

{
  int i_00;
  int local_20;
  int i;
  int vel_local;
  int note_local;
  int chan_local;
  Renderer *this_local;
  
  if (vel == 0) {
    note_off(this,chan,note,0);
  }
  else {
    local_20 = this->voices;
    while (i_00 = local_20 + -1, local_20 != 0) {
      local_20 = i_00;
      if (((uint)this->voice[i_00].channel == chan) &&
         ((((uint)this->voice[i_00].note == note &&
           (((this->voice[i_00].sample)->self_nonexclusive & 1U) == 0)) ||
          (this->channel[chan].mono != 0)))) {
        if (this->channel[chan].mono == 0) {
          finish_note(this,i_00);
        }
        else {
          kill_note(this,i_00);
        }
      }
    }
    start_note(this,chan,note,vel);
  }
  return;
}

Assistant:

void Renderer::note_on(int chan, int note, int vel)
{
	if (vel == 0)
	{
		note_off(chan, note, 0);
		return;
	}

	int i = voices;

	/* Only one instance of a note can be playing on a single channel. */
	while (i--)
	{
		if (voice[i].channel == chan && ((voice[i].note == note && !voice[i].sample->self_nonexclusive) || channel[chan].mono))
		{
			if (channel[chan].mono)
			{
				kill_note(i);
			}
			else
			{
				finish_note(i);
			}
		}
	}

	start_note(chan, note, vel);
}